

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

char * NameWriteUnsigned(char *pos,uint value)

{
  long lVar1;
  char cStack_19;
  char reverse [16];
  
  reverse[0] = (byte)(value % 10) | 0x30;
  lVar1 = 1;
  for (; 9 < value; value = (uint)((ulong)value / 10)) {
    reverse[lVar1] = (byte)(((ulong)value / 10) % 10) | 0x30;
    lVar1 = lVar1 + 1;
  }
  do {
    *pos = reverse[lVar1 + -1];
    pos = pos + 1;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return pos;
}

Assistant:

char* NameWriteUnsigned(char *pos, unsigned value)
{
	char reverse[16];
	char *curr = reverse;

	*curr++ = (char)((value % 10) + '0');

	while(value /= 10)
		*curr++ = (char)((value % 10) + '0');

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != reverse);

	return pos;
}